

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitExpr
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ConditionalExpression *expr)

{
  bool bVar1;
  size_t sVar2;
  Expression *pEVar3;
  bool bVar4;
  bool prevInCondition_1;
  int iVar5;
  int iVar6;
  bool prevInCondition;
  pointer pCVar7;
  int iVar8;
  ConstantValue knownVal;
  ConstantValue cv;
  undefined1 local_d1;
  ConditionalExpression *local_d0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_c8;
  uint local_c0;
  undefined1 local_bc;
  byte local_bb;
  pointer local_b8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *local_b0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_a8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  undefined1 local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  SVInt::SVInt((SVInt *)&local_a8,(SVIntStorage *)SVInt::One);
  local_a8._M_index = '\x01';
  sVar2 = (expr->conditions)._M_extent._M_extent_value;
  local_d0 = expr;
  if (sVar2 == 0) {
    iVar6 = 0;
  }
  else {
    pCVar7 = (expr->conditions)._M_ptr;
    local_b8 = pCVar7 + sVar2;
    iVar6 = 0;
    do {
      pEVar3 = (pCVar7->expr).ptr;
      bVar4 = this->inCondition;
      this->inCondition = true;
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar3,pEVar3,(TestAnalysis *)this);
      this->inCondition = bVar4;
      adjustConditionalState((ConstantValue *)&local_58,this,pEVar3);
      if (local_a8._M_index == '\0' || local_58._M_index == '\0') {
        local_60 = 0;
        if (local_a8._M_index != '\0') {
          std::
          variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
          ::emplace<0ul,std::monostate>
                    ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                      *)&local_a8,(monostate *)&local_80);
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_80);
      }
      else {
        bVar4 = ConstantValue::isTrue((ConstantValue *)&local_a8);
        if (bVar4) {
          bVar4 = ConstantValue::isTrue((ConstantValue *)&local_58);
        }
        else {
          bVar4 = false;
        }
        SVInt::SVInt<int>((SVInt *)&local_c8,(uint)bVar4);
        local_80._0_8_ = local_c8;
        local_80._8_4_ = local_c0;
        local_80._12_1_ = local_bc;
        local_80._13_1_ = local_bb;
        if (0x40 < local_c0 || (local_bb & 1) != 0) {
          local_c8.val = 0;
        }
        local_60 = 1;
        local_b0 = &local_a8;
        std::operator=(&local_b0,&local_80,&local_d1);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_80);
        if (((0x40 < local_c0) || ((local_bb & 1) != 0)) && ((void *)local_c8.val != (void *)0x0)) {
          operator_delete__(local_c8.pVal);
        }
      }
      if (pCVar7->pattern != (Pattern *)0x0) {
        ast::Pattern::visit<TestAnalysis>(pCVar7->pattern,(TestAnalysis *)this);
      }
      iVar6 = iVar6 + this->stateWhenFalse;
      this->isStateSplit = false;
      this->state = this->stateWhenTrue;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != local_b8);
  }
  if (local_a8._M_index == '\0') {
    pEVar3 = local_d0->left_;
    this->isStateSplit = false;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    bVar4 = this->inCondition;
    this->inCondition = true;
    ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
              (pEVar3,pEVar3,(TestAnalysis *)this);
    this->inCondition = bVar4;
    bVar1 = this->isStateSplit;
    if (bVar1 == false) {
      iVar5 = this->state;
      iVar8 = iVar5;
    }
    else {
      iVar5 = this->stateWhenTrue;
      iVar8 = this->stateWhenFalse;
    }
    pEVar3 = local_d0->right_;
    this->isStateSplit = false;
    this->state = iVar6;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    this->inCondition = true;
    ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
              (pEVar3,pEVar3,(TestAnalysis *)this);
    this->inCondition = bVar4;
    if ((bVar1 == false) && (this->isStateSplit == false)) {
      this->state = this->state + iVar5;
    }
    else {
      if (this->isStateSplit == false) {
        iVar6 = this->state;
        this->isStateSplit = true;
        this->state = 0;
        this->stateWhenTrue = iVar6;
        this->stateWhenFalse = iVar6;
      }
      this->stateWhenTrue = this->stateWhenTrue + iVar5;
      this->stateWhenFalse = this->stateWhenFalse + iVar8;
    }
  }
  else {
    iVar5 = this->state;
    bVar4 = ConstantValue::isTrue((ConstantValue *)&local_a8);
    if (bVar4) {
      pEVar3 = local_d0->right_;
      this->isStateSplit = false;
      this->state = iVar6;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      bVar4 = this->inCondition;
      this->inCondition = true;
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar3,pEVar3,(TestAnalysis *)this);
      this->inCondition = bVar4;
      pEVar3 = local_d0->left_;
      this->isStateSplit = false;
      this->inCondition = true;
      this->state = iVar5;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar3,pEVar3,(TestAnalysis *)this);
      this->inCondition = bVar4;
    }
    else {
      pEVar3 = local_d0->left_;
      this->isStateSplit = false;
      this->state = iVar5;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      bVar4 = this->inCondition;
      this->inCondition = true;
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar3,pEVar3,(TestAnalysis *)this);
      this->inCondition = bVar4;
      pEVar3 = local_d0->right_;
      this->isStateSplit = false;
      this->inCondition = true;
      this->state = iVar6;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar3,pEVar3,(TestAnalysis *)this);
      this->inCondition = bVar4;
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_a8);
  return;
}

Assistant:

void visitExpr(const ConditionalExpression& expr) {
        // TODO: handle the special ambiguous 'x merging of both sides
        ConstantValue knownVal = SVInt::One;
        auto falseState = (DERIVED).unreachableState();
        for (auto& cond : expr.conditions) {
            auto cv = visitCondition(*cond.expr);
            if (cv && knownVal)
                knownVal = SVInt(knownVal.isTrue() && cv.isTrue() ? 1 : 0);
            else
                knownVal = nullptr;

            if (cond.pattern)
                visit(*cond.pattern);

            (DERIVED).joinState(falseState, stateWhenFalse);
            setState(std::move(stateWhenTrue));
        }

        auto visitSide = [this](const Expression& expr, TState&& newState) {
            setState(std::move(newState));
            visitNoJoin(expr);
        };

        auto trueState = std::move(state);
        if (knownVal) {
            // Special case: if the condition is constant, we will visit
            // the opposing side first and then essentially throw that
            // state away instead of joining it.
            if (knownVal.isTrue()) {
                visitSide(expr.right(), std::move(falseState));
                visitSide(expr.left(), std::move(trueState));
            }
            else {
                visitSide(expr.left(), std::move(trueState));
                visitSide(expr.right(), std::move(falseState));
            }
        }
        else {
            // Otherwise visit both sides and join as needed.
            visitSide(expr.left(), std::move(trueState));

            bool conditionalAfterLeft = isStateSplit;
            TState trueAfterLeft, falseAfterLeft;
            if (conditionalAfterLeft) {
                trueAfterLeft = std::move(stateWhenTrue);
                falseAfterLeft = std::move(stateWhenFalse);
            }
            else {
                trueAfterLeft = (DERIVED).copyState(state);
                falseAfterLeft = std::move(state);
            }

            visitSide(expr.right(), std::move(falseState));
            if (!conditionalAfterLeft && !isStateSplit) {
                (DERIVED).joinState(state, trueAfterLeft);
            }
            else {
                split();
                (DERIVED).joinState(stateWhenTrue, trueAfterLeft);
                (DERIVED).joinState(stateWhenFalse, falseAfterLeft);
            }
        }
    }